

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PagePool.h
# Opt level: O3

void __thiscall Memory::PagePool::~PagePool(PagePool *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  PagePoolFreePage *pPVar4;
  PagePoolFreePage *page;
  PagePoolFreePage *address;
  undefined8 *in_FS_OFFSET;
  
  if (this->freePageList != (PagePoolFreePage *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PagePool.h"
                       ,0x5c,"(freePageList == nullptr)","freePageList == nullptr");
    if (!bVar3) {
LAB_00276dfe:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  address = this->reservedPageList;
  if (address != (PagePoolFreePage *)0x0) {
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    do {
      pPVar4 = address;
      if ((address->super_PagePoolPage).isReserved == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PagePool.h"
                           ,99,"(page->IsReserved())","page->IsReserved()");
        if (!bVar3) goto LAB_00276dfe;
        *puVar1 = 0;
        pPVar4 = this->reservedPageList;
      }
      this->reservedPageList = pPVar4->nextFreePage;
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::ReleasePages((address->super_PagePoolPage).pageAllocator,address,1,
                     (address->super_PagePoolPage).pageSegment);
      address = this->reservedPageList;
    } while (address != (PagePoolFreePage *)0x0);
  }
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::~PageAllocatorBase(&this->pageAllocator);
  return;
}

Assistant:

~PagePool()
    {
        Assert(freePageList == nullptr);

        if (reservedPageList != nullptr)
        {
            while (reservedPageList != nullptr)
            {
                PagePoolFreePage * page = reservedPageList;
                Assert(page->IsReserved());
                reservedPageList = reservedPageList->nextFreePage;
                page->Free();
            }
        }
    }